

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

reference __thiscall
slang::
SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
::emplace_back<>(SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                 *this)

{
  EVP_PKEY_CTX *pEVar1;
  undefined8 *puVar2;
  ulong uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  pointer puVar7;
  EVP_PKEY_CTX *pEVar8;
  long lVar9;
  size_type sVar10;
  long lVar11;
  EVP_PKEY_CTX *pEVar12;
  EVP_PKEY_CTX *ctx;
  ulong uVar13;
  
  pEVar12 = (EVP_PKEY_CTX *)(this->data_ + this->len);
  if (this->len != this->cap) {
    *(undefined8 *)pEVar12 = 0x3f;
    *(undefined8 *)(pEVar12 + 8) = 1;
    *(undefined8 *)(pEVar12 + 0x18) = 0;
    *(undefined1 **)(pEVar12 + 0x10) =
         &boost::unordered::detail::foa::
          dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
          ::storage;
    *(undefined8 *)(pEVar12 + 0x20) = 0;
    *(undefined8 *)(pEVar12 + 0x28) = 0;
    sVar10 = this->len;
    this->len = sVar10 + 1;
    return this->data_ + sVar10;
  }
  if (this->len == 0x2aaaaaaaaaaaaaa) {
    detail::throwLengthError();
  }
  uVar13 = this->len + 1;
  uVar3 = this->cap;
  if (uVar13 < uVar3 * 2) {
    uVar13 = uVar3 * 2;
  }
  if (0x2aaaaaaaaaaaaaa - uVar3 < uVar3) {
    uVar13 = 0x2aaaaaaaaaaaaaa;
  }
  lVar11 = (long)pEVar12 - (long)this->data_;
  puVar7 = (pointer)operator_new(uVar13 * 0x30);
  *(undefined8 *)((long)puVar7 + lVar11) = 0x3f;
  *(undefined8 *)((long)puVar7 + lVar11 + 8) = 1;
  *(undefined8 *)((long)puVar7 + lVar11 + 0x18) = 0;
  *(undefined1 **)((long)puVar7 + lVar11 + 0x10) =
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  puVar2 = (undefined8 *)((long)puVar7 + lVar11 + 0x20);
  *puVar2 = 0;
  puVar2[1] = 0;
  pEVar8 = (EVP_PKEY_CTX *)this->data_;
  sVar10 = this->len;
  ctx = pEVar8 + sVar10 * 0x30;
  if (ctx == pEVar12) {
    if (sVar10 != 0) {
      lVar9 = 0;
      do {
        pEVar1 = pEVar8 + lVar9;
        ctx = pEVar1 + 0x30;
        uVar4 = *(undefined8 *)pEVar1;
        uVar5 = *(undefined8 *)(pEVar1 + 8);
        uVar6 = *(undefined8 *)(pEVar1 + 0x18);
        puVar2 = (undefined8 *)
                 ((long)&(puVar7->table_).
                         super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                         .arrays.groups_ + lVar9);
        *puVar2 = *(undefined8 *)(pEVar1 + 0x10);
        puVar2[1] = uVar6;
        puVar2 = (undefined8 *)
                 ((long)&(puVar7->table_).
                         super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                         .arrays.groups_size_index + lVar9);
        *puVar2 = uVar4;
        puVar2[1] = uVar5;
        uVar4 = *(undefined8 *)(pEVar1 + 0x28);
        puVar2 = (undefined8 *)
                 ((long)&(puVar7->table_).
                         super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                         .size_ctrl.ml + lVar9);
        *puVar2 = *(undefined8 *)(pEVar1 + 0x20);
        puVar2[1] = uVar4;
        *(undefined8 *)pEVar1 = 0x3f;
        *(undefined8 *)(pEVar1 + 8) = 1;
        *(undefined1 **)(pEVar1 + 0x10) =
             &boost::unordered::detail::foa::
              dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
              ::storage;
        *(undefined8 *)(pEVar1 + 0x18) = 0;
        *(undefined8 *)(pEVar1 + 0x20) = 0;
        *(undefined8 *)(pEVar1 + 0x28) = 0;
        lVar9 = lVar9 + 0x30;
      } while (ctx != pEVar12);
    }
  }
  else {
    if (pEVar8 != pEVar12) {
      lVar9 = 0;
      do {
        pEVar1 = pEVar8 + lVar9;
        ctx = pEVar1 + 0x30;
        uVar4 = *(undefined8 *)pEVar1;
        uVar5 = *(undefined8 *)(pEVar1 + 8);
        uVar6 = *(undefined8 *)(pEVar1 + 0x18);
        puVar2 = (undefined8 *)
                 ((long)&(puVar7->table_).
                         super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                         .arrays.groups_ + lVar9);
        *puVar2 = *(undefined8 *)(pEVar1 + 0x10);
        puVar2[1] = uVar6;
        puVar2 = (undefined8 *)
                 ((long)&(puVar7->table_).
                         super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                         .arrays.groups_size_index + lVar9);
        *puVar2 = uVar4;
        puVar2[1] = uVar5;
        uVar4 = *(undefined8 *)(pEVar1 + 0x28);
        puVar2 = (undefined8 *)
                 ((long)&(puVar7->table_).
                         super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                         .size_ctrl.ml + lVar9);
        *puVar2 = *(undefined8 *)(pEVar1 + 0x20);
        puVar2[1] = uVar4;
        *(undefined8 *)pEVar1 = 0x3f;
        *(undefined8 *)(pEVar1 + 8) = 1;
        *(undefined1 **)(pEVar1 + 0x10) =
             &boost::unordered::detail::foa::
              dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
              ::storage;
        *(undefined8 *)(pEVar1 + 0x18) = 0;
        *(undefined8 *)(pEVar1 + 0x20) = 0;
        *(undefined8 *)(pEVar1 + 0x28) = 0;
        lVar9 = lVar9 + 0x30;
      } while (ctx != pEVar12);
      pEVar8 = (EVP_PKEY_CTX *)this->data_;
      sVar10 = this->len;
    }
    if (pEVar8 + sVar10 * 0x30 != pEVar12) {
      ctx = (EVP_PKEY_CTX *)0x0;
      do {
        pEVar1 = pEVar12 + (long)ctx;
        uVar4 = *(undefined8 *)pEVar1;
        uVar5 = *(undefined8 *)(pEVar1 + 8);
        uVar6 = *(undefined8 *)(pEVar1 + 0x18);
        *(undefined8 *)(ctx + (long)puVar7 + lVar11 + 0x40) = *(undefined8 *)(pEVar1 + 0x10);
        *(undefined8 *)(ctx + (long)puVar7 + lVar11 + 0x40 + 8) = uVar6;
        *(undefined8 *)(ctx + (long)puVar7 + lVar11 + 0x30) = uVar4;
        *(undefined8 *)(ctx + (long)puVar7 + lVar11 + 0x30 + 8) = uVar5;
        uVar4 = *(undefined8 *)(pEVar1 + 0x28);
        *(undefined8 *)(ctx + (long)puVar7 + lVar11 + 0x50) = *(undefined8 *)(pEVar1 + 0x20);
        *(undefined8 *)(ctx + (long)puVar7 + lVar11 + 0x50 + 8) = uVar4;
        *(undefined8 *)pEVar1 = 0x3f;
        *(undefined8 *)(pEVar1 + 8) = 1;
        *(undefined1 **)(pEVar1 + 0x10) =
             &boost::unordered::detail::foa::
              dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
              ::storage;
        *(undefined8 *)(pEVar1 + 0x18) = 0;
        *(undefined8 *)(pEVar1 + 0x20) = 0;
        *(undefined8 *)(pEVar1 + 0x28) = 0;
        ctx = ctx + 0x30;
      } while (pEVar1 + 0x30 != pEVar8 + sVar10 * 0x30);
    }
  }
  cleanup(this,ctx);
  this->len = this->len + 1;
  this->cap = uVar13;
  this->data_ = puVar7;
  return (reference)((long)puVar7 + lVar11);
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }